

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O0

Vector * noise_3d(Vector *__return_storage_ptr__,Vector *p)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double z;
  double y;
  double x;
  Vector v;
  int m;
  double pz;
  double py;
  double px;
  double s;
  long jz;
  long jy;
  long jx;
  long iz;
  long iy;
  long ix;
  double tz;
  double ty;
  double tx;
  double sz;
  double sy;
  double sx;
  Vector *p_local;
  Vector *result;
  
  sx = (double)p;
  p_local = __return_storage_ptr__;
  Vector::Vector(__return_storage_ptr__,0.0);
  Vector::Vector((Vector *)&x,(Vector *)sx);
  Noise3dCalls = Noise3dCalls + 1;
  setup_lattice((Vector *)&x,&iy,&iz,&jx,&jy,&jz,(long *)&s,&sy,&sz,&tx,&ty,&tz,(double *)&ix);
  uVar1 = HASH((int)iy,(int)iz,(int)jx);
  v.z._4_4_ = uVar1 & 0xff;
  dVar2 = x - (double)iy;
  dVar3 = v.x - (double)iz;
  dVar4 = v.y - (double)jx;
  dVar5 = ty * tz * (double)ix;
  dVar6 = INCRSUM(v.z._4_4_,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->x = dVar6;
  dVar6 = INCRSUM(v.z._4_4_ + 4,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->y = dVar6;
  dVar2 = INCRSUM(v.z._4_4_ + 8,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->z = dVar2;
  uVar1 = HASH((int)jy,(int)iz,(int)jx);
  v.z._4_4_ = uVar1 & 0xff;
  dVar2 = x - (double)jy;
  dVar5 = sy * tz * (double)ix;
  dVar6 = INCRSUM(v.z._4_4_,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->x = dVar6 + __return_storage_ptr__->x;
  dVar6 = INCRSUM(v.z._4_4_ + 4,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->y = dVar6 + __return_storage_ptr__->y;
  dVar3 = INCRSUM(v.z._4_4_ + 8,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->z = dVar3 + __return_storage_ptr__->z;
  uVar1 = HASH((int)jy,(int)jz,(int)jx);
  v.z._4_4_ = uVar1 & 0xff;
  dVar3 = v.x - (double)jz;
  dVar5 = sy * sz * (double)ix;
  dVar6 = INCRSUM(v.z._4_4_,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->x = dVar6 + __return_storage_ptr__->x;
  dVar6 = INCRSUM(v.z._4_4_ + 4,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->y = dVar6 + __return_storage_ptr__->y;
  dVar2 = INCRSUM(v.z._4_4_ + 8,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->z = dVar2 + __return_storage_ptr__->z;
  uVar1 = HASH((int)iy,(int)jz,(int)jx);
  v.z._4_4_ = uVar1 & 0xff;
  dVar2 = x - (double)iy;
  dVar5 = ty * sz * (double)ix;
  dVar6 = INCRSUM(v.z._4_4_,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->x = dVar6 + __return_storage_ptr__->x;
  dVar6 = INCRSUM(v.z._4_4_ + 4,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->y = dVar6 + __return_storage_ptr__->y;
  dVar4 = INCRSUM(v.z._4_4_ + 8,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->z = dVar4 + __return_storage_ptr__->z;
  uVar1 = HASH((int)iy,(int)jz,SUB84(s,0));
  v.z._4_4_ = uVar1 & 0xff;
  dVar4 = v.y - (double)(long)s;
  dVar5 = ty * sz * tx;
  dVar6 = INCRSUM(v.z._4_4_,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->x = dVar6 + __return_storage_ptr__->x;
  dVar6 = INCRSUM(v.z._4_4_ + 4,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->y = dVar6 + __return_storage_ptr__->y;
  dVar2 = INCRSUM(v.z._4_4_ + 8,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->z = dVar2 + __return_storage_ptr__->z;
  uVar1 = HASH((int)jy,(int)jz,s._0_4_);
  v.z._4_4_ = uVar1 & 0xff;
  dVar2 = x - (double)jy;
  dVar5 = sy * sz * tx;
  dVar6 = INCRSUM(v.z._4_4_,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->x = dVar6 + __return_storage_ptr__->x;
  dVar6 = INCRSUM(v.z._4_4_ + 4,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->y = dVar6 + __return_storage_ptr__->y;
  dVar3 = INCRSUM(v.z._4_4_ + 8,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->z = dVar3 + __return_storage_ptr__->z;
  uVar1 = HASH((int)jy,(int)iz,s._0_4_);
  v.z._4_4_ = uVar1 & 0xff;
  dVar3 = v.x - (double)iz;
  dVar5 = sy * tz * tx;
  dVar6 = INCRSUM(v.z._4_4_,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->x = dVar6 + __return_storage_ptr__->x;
  dVar6 = INCRSUM(v.z._4_4_ + 4,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->y = dVar6 + __return_storage_ptr__->y;
  dVar2 = INCRSUM(v.z._4_4_ + 8,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->z = dVar2 + __return_storage_ptr__->z;
  uVar1 = HASH((int)iy,(int)iz,s._0_4_);
  v.z._4_4_ = uVar1 & 0xff;
  dVar2 = x - (double)iy;
  dVar5 = ty * tz * tx;
  dVar6 = INCRSUM(v.z._4_4_,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->x = dVar6 + __return_storage_ptr__->x;
  dVar6 = INCRSUM(v.z._4_4_ + 4,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->y = dVar6 + __return_storage_ptr__->y;
  dVar2 = INCRSUM(v.z._4_4_ + 8,dVar5,dVar2,dVar3,dVar4);
  __return_storage_ptr__->z = dVar2 + __return_storage_ptr__->z;
  return __return_storage_ptr__;
}

Assistant:

Vector noise_3d( const Vector& p )
{
   double sx,sy,sz,tx,ty,tz;
   long ix,iy,iz,jx,jy,jz;
   double s, px, py, pz;
   int   m;
   Vector result (0);
   Vector v = p;

   Noise3dCalls++;

   setup_lattice(v,ix,iy,iz,jx,jy,jz,sx,sy,sz,tx,ty,tz);

   double x = v.x;
   double y = v.y;
   double z = v.z;
   //
   // Interpolate
   //
   m =   HASH( ix, iy, iz ) & 0xFF;
   px = x-ix;  py = y-iy;  pz = z-iz;
   s =   tx*ty*tz;
   result.x = INCRSUM(m,s,px,py,pz);
   result.y = INCRSUM(m+4,s,px,py,pz);
   result.z = INCRSUM(m+8,s,px,py,pz);

   m =   HASH( jx, iy, iz ) & 0xFF;
   px = x-jx;
   s =   sx*ty*tz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( jx, jy, iz ) & 0xFF;
   py = y-jy;
   s =   sx*sy*tz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( ix, jy, iz ) & 0xFF;
   px = x-ix;
   s =   tx*sy*tz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( ix, jy, jz ) & 0xFF;
   pz = z-jz;
   s =   tx*sy*sz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( jx, jy, jz ) & 0xFF;
   px = x-jx;
   s =   sx*sy*sz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( jx, iy, jz ) & 0xFF;
   py = y-iy;
   s =   sx*ty*sz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( ix, iy, jz ) & 0xFF;
   px = x-ix;
   s =   tx*ty*sz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

// DEBUG
// printf("Noise3D: result == <%g %g %g>\n",result.x,result.y,result.z);
   return result;
}